

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O1

lzma_ret validate_chain(lzma_filter *filters,size_t *count)

{
  bool bVar1;
  long lVar2;
  lzma_ret lVar3;
  anon_struct_24_5_040317c8 *paVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  
  lVar3 = LZMA_PROG_ERROR;
  if ((filters != (lzma_filter *)0x0) && (filters->id != 0xffffffffffffffff)) {
    bVar7 = 1;
    uVar5 = 0;
    bVar8 = 0;
    uVar6 = 0;
    do {
      paVar4 = features;
      if (filters[uVar6].id != 0x4000000000000001) {
        lVar2 = 0;
        do {
          lVar9 = lVar2;
          if (lVar9 + 0x18 == 0xf0) goto LAB_0054ad5e;
          lVar2 = lVar9 + 0x18;
        } while (filters[uVar6].id != *(lzma_vli *)((long)&features[1].id + lVar9));
        paVar4 = (anon_struct_24_5_040317c8 *)(lVar9 + 0x5efe18);
      }
      if ((bVar7 & 1) == 0) {
LAB_0054ad5e:
        bVar1 = false;
      }
      else {
        bVar7 = paVar4->non_last_ok;
        bVar8 = paVar4->last_ok;
        uVar5 = uVar5 + paVar4->changes_size;
        bVar1 = true;
      }
      lVar3 = LZMA_OPTIONS_ERROR;
      if (!bVar1) {
        return LZMA_OPTIONS_ERROR;
      }
      uVar6 = uVar6 + 1;
    } while (filters[uVar6].id != 0xffffffffffffffff);
    if (((uVar6 < 5) && ((bVar8 & 1) != 0)) && (uVar5 < 4)) {
      *count = uVar6;
      lVar3 = LZMA_OK;
    }
  }
  return lVar3;
}

Assistant:

static lzma_ret
validate_chain(const lzma_filter *filters, size_t *count)
{
	// Number of non-last filters that may change the size of the data
	// significantly (that is, more than 1-2 % or so).
	size_t changes_size_count = 0;

	// True if it is OK to add a new filter after the current filter.
	bool non_last_ok = true;

	// True if the last filter in the given chain is actually usable as
	// the last filter. Only filters that support embedding End of Payload
	// Marker can be used as the last filter in the chain.
	bool last_ok = false;

	size_t i = 0;

	// There must be at least one filter.
	if (filters == NULL || filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	do {
		size_t j;
		for (j = 0; filters[i].id != features[j].id; ++j)
			if (features[j].id == LZMA_VLI_UNKNOWN)
				return LZMA_OPTIONS_ERROR;

		// If the previous filter in the chain cannot be a non-last
		// filter, the chain is invalid.
		if (!non_last_ok)
			return LZMA_OPTIONS_ERROR;

		non_last_ok = features[j].non_last_ok;
		last_ok = features[j].last_ok;
		changes_size_count += features[j].changes_size;

	} while (filters[++i].id != LZMA_VLI_UNKNOWN);

	// There must be 1-4 filters. The last filter must be usable as
	// the last filter in the chain. A maximum of three filters are
	// allowed to change the size of the data.
	if (i > LZMA_FILTERS_MAX || !last_ok || changes_size_count > 3)
		return LZMA_OPTIONS_ERROR;

	*count = i;
	return LZMA_OK;
}